

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EnumInfo * __thiscall
Catch::Detail::EnumValuesRegistry::registerEnum
          (EnumValuesRegistry *this,StringRef enumName,StringRef allValueNames,
          vector<int,_std::allocator<int>_> *values)

{
  reference this_00;
  type pEVar1;
  StringRef enumName_00;
  StringRef allValueNames_00;
  value_type local_40;
  vector<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *values_local;
  EnumValuesRegistry *this_local;
  StringRef allValueNames_local;
  StringRef enumName_local;
  
  allValueNames_local.m_start = (char *)allValueNames.m_size;
  allValueNames_00.m_size = (EnumValuesRegistry *)allValueNames.m_start;
  allValueNames_00.m_start = (char *)enumName.m_size;
  enumName_00.m_size = enumName.m_start;
  enumName_00.m_start = (char *)&local_40;
  local_38 = values;
  values_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = allValueNames_00.m_size;
  allValueNames_local.m_size = (size_type)enumName_00.m_size;
  makeEnumInfo(enumName_00,allValueNames_00,
               (vector<int,_std::allocator<int>_> *)allValueNames_local.m_start);
  clara::std::
  vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
  ::push_back(&this->m_enumInfos,&local_40);
  clara::std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
  ~unique_ptr(&local_40);
  this_00 = clara::std::
            vector<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
            ::back(&this->m_enumInfos);
  pEVar1 = clara::std::
           unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>::
           operator*(this_00);
  return pEVar1;
}

Assistant:

EnumInfo const& EnumValuesRegistry::registerEnum( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            m_enumInfos.push_back(makeEnumInfo(enumName, allValueNames, values));
            return *m_enumInfos.back();
        }